

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

void Sbd_StoStoreResult(Sbd_Sto_t *p,int iObj,Sbd_Cut_t **pCuts,int nCuts)

{
  Vec_Int_t *p_00;
  Vec_Int_t *vList;
  int local_28;
  int v;
  int i;
  int nCuts_local;
  Sbd_Cut_t **pCuts_local;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  p_00 = Vec_WecEntry(p->vCuts,iObj);
  Vec_IntPush(p_00,nCuts);
  for (local_28 = 0; local_28 < nCuts; local_28 = local_28 + 1) {
    Vec_IntPush(p_00,*(uint *)&pCuts[local_28]->field_0x14 >> 0x1c);
    for (vList._4_4_ = 0; vList._4_4_ < (int)(*(uint *)&pCuts[local_28]->field_0x14 >> 0x1c);
        vList._4_4_ = vList._4_4_ + 1) {
      Vec_IntPush(p_00,pCuts[local_28]->pLeaves[vList._4_4_]);
    }
    Vec_IntPush(p_00,pCuts[local_28]->iFunc);
  }
  return;
}

Assistant:

static inline void Sbd_StoStoreResult( Sbd_Sto_t * p, int iObj, Sbd_Cut_t ** pCuts, int nCuts )
{
    int i, v;
    Vec_Int_t * vList = Vec_WecEntry( p->vCuts, iObj );
    Vec_IntPush( vList, nCuts );
    for ( i = 0; i < nCuts; i++ )
    {
        Vec_IntPush( vList, pCuts[i]->nLeaves );
        for ( v = 0; v < (int)pCuts[i]->nLeaves; v++ )
            Vec_IntPush( vList, pCuts[i]->pLeaves[v] );
        Vec_IntPush( vList, pCuts[i]->iFunc );
    }
}